

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceSerializeTest_DontSerializeDefaultValuesTest_Test<absl::lts_20250127::Cord>::TestBody
          (NoFieldPresenceSerializeTest_DontSerializeDefaultValuesTest_Test<absl::lts_20250127::Cord>
           *this)

{
  bool bVar1;
  Cord *output;
  char *pcVar2;
  uint32_t *puVar3;
  Arena *pAVar4;
  char *in_R9;
  AssertHelper local_5c8;
  Message local_5c0;
  string local_5b8;
  unsigned_long local_598;
  int local_58c;
  undefined1 local_588 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_558;
  Message local_550;
  bool local_541;
  undefined1 local_540 [8];
  AssertionResult gtest_ar__3;
  Message local_528;
  string local_520;
  undefined1 local_500 [8];
  AssertionResult gtest_ar_3;
  Message local_4e8;
  string local_4e0;
  unsigned_long local_4c0;
  int local_4b4;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_480;
  Message local_478;
  bool local_469;
  undefined1 local_468 [8];
  AssertionResult gtest_ar__2;
  Message local_450;
  string local_448;
  unsigned_long local_428;
  int local_41c;
  undefined1 local_418 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_3e8;
  Message local_3e0;
  bool local_3d1;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar__1;
  Message local_3b8;
  string local_3b0;
  unsigned_long local_390;
  int local_384;
  undefined1 local_380 [8];
  AssertionResult gtest_ar;
  string local_368;
  AssertHelper local_348;
  Message local_340;
  bool local_331;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_;
  TypeParam *output_sink;
  TestAllTypes message;
  NoFieldPresenceSerializeTest_DontSerializeDefaultValuesTest_Test<absl::lts_20250127::Cord>
  *this_local;
  
  message.field_0._664_8_ = this;
  proto2_nofieldpresence_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)&output_sink);
  output = NoFieldPresenceSerializeTest<absl::lts_20250127::Cord>::GetOutputSinkRef
                     (&this->super_NoFieldPresenceSerializeTest<absl::lts_20250127::Cord>);
  local_331 = TestSerialize<absl::lts_20250127::Cord>((MessageLite *)&output_sink,output);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_330,&local_331,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar1) {
    testing::Message::Message(&local_340);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_368,(internal *)local_330,
               (AssertionResult *)"TestSerialize(message, &output_sink)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x454,pcVar2);
    testing::internal::AssertHelper::operator=(&local_348,&local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    std::__cxx11::string::~string((string *)&local_368);
    testing::Message::~Message(&local_340);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_384 = 0;
    protobuf::(anonymous_namespace)::NoFieldPresenceSerializeTest<absl::lts_20250127::Cord>::
    GetOutput_abi_cxx11_(&local_3b0,this);
    local_390 = std::__cxx11::string::size();
    testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
              ((EqHelper *)local_380,"0","this->GetOutput().size()",&local_384,&local_390);
    std::__cxx11::string::~string((string *)&local_3b0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
    if (!bVar1) {
      testing::Message::Message(&local_3b8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                 ,0x455,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_3b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_3b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
    proto2_nofieldpresence_unittest::TestAllTypes::set_optional_int32
              ((TestAllTypes *)&output_sink,0);
    proto2_nofieldpresence_unittest::TestAllTypes::set_optional_int64
              ((TestAllTypes *)&output_sink,0);
    proto2_nofieldpresence_unittest::TestAllTypes::set_optional_uint32
              ((TestAllTypes *)&output_sink,0);
    proto2_nofieldpresence_unittest::TestAllTypes::set_optional_uint64
              ((TestAllTypes *)&output_sink,0);
    proto2_nofieldpresence_unittest::TestAllTypes::set_optional_sint32
              ((TestAllTypes *)&output_sink,0);
    proto2_nofieldpresence_unittest::TestAllTypes::set_optional_sint64
              ((TestAllTypes *)&output_sink,0);
    proto2_nofieldpresence_unittest::TestAllTypes::set_optional_fixed32
              ((TestAllTypes *)&output_sink,0);
    proto2_nofieldpresence_unittest::TestAllTypes::set_optional_fixed64
              ((TestAllTypes *)&output_sink,0);
    proto2_nofieldpresence_unittest::TestAllTypes::set_optional_sfixed32
              ((TestAllTypes *)&output_sink,0);
    proto2_nofieldpresence_unittest::TestAllTypes::set_optional_sfixed64
              ((TestAllTypes *)&output_sink,0);
    proto2_nofieldpresence_unittest::TestAllTypes::set_optional_float
              ((TestAllTypes *)&output_sink,0.0);
    proto2_nofieldpresence_unittest::TestAllTypes::set_optional_double
              ((TestAllTypes *)&output_sink,0.0);
    proto2_nofieldpresence_unittest::TestAllTypes::set_optional_bool
              ((TestAllTypes *)&output_sink,false);
    puVar3 = internal::HasBits<1>::operator[]
                       ((HasBits<1> *)&message.super_Message.super_MessageLite._internal_metadata_,0
                       );
    *(byte *)puVar3 = (byte)*puVar3 | 1;
    pAVar4 = protobuf::MessageLite::GetArena((MessageLite *)&output_sink);
    internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)
               &message.field_0._impl_.repeated_lazy_message_.super_RepeatedPtrFieldBase.arena_,
               anon_var_dwarf_37cdd0 + 5,pAVar4);
    puVar3 = internal::HasBits<1>::operator[]
                       ((HasBits<1> *)&message.super_Message.super_MessageLite._internal_metadata_,0
                       );
    *(byte *)puVar3 = (byte)*puVar3 | 2;
    pAVar4 = protobuf::MessageLite::GetArena((MessageLite *)&output_sink);
    internal::ArenaStringPtr::SetBytes
              (&message.field_0._impl_.optional_string_,anon_var_dwarf_37cdd0 + 5,pAVar4);
    proto2_nofieldpresence_unittest::TestAllTypes::set_optional_nested_enum
              ((TestAllTypes *)&output_sink,TestAllTypes_NestedEnum_FOO);
    proto2_nofieldpresence_unittest::TestAllTypes::set_optional_foreign_enum
              ((TestAllTypes *)&output_sink,FOREIGN_FOO);
    puVar3 = internal::HasBits<1>::operator[]
                       ((HasBits<1> *)&message.super_Message.super_MessageLite._internal_metadata_,0
                       );
    *(byte *)puVar3 = (byte)*puVar3 | 4;
    pAVar4 = protobuf::MessageLite::GetArena((MessageLite *)&output_sink);
    internal::ArenaStringPtr::Set
              (&message.field_0._impl_.optional_bytes_,anon_var_dwarf_37cdd0 + 5,pAVar4);
    local_3d1 = TestSerialize<absl::lts_20250127::Cord>((MessageLite *)&output_sink,output);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_3d0,&local_3d1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
    if (!bVar1) {
      testing::Message::Message(&local_3e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_1.message_,(internal *)local_3d0,
                 (AssertionResult *)"TestSerialize(message, &output_sink)","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_3e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                 ,0x46b,pcVar2);
      testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
      testing::internal::AssertHelper::~AssertHelper(&local_3e8);
      std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_3e0);
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      local_41c = 0;
      protobuf::(anonymous_namespace)::NoFieldPresenceSerializeTest<absl::lts_20250127::Cord>::
      GetOutput_abi_cxx11_(&local_448,this);
      local_428 = std::__cxx11::string::size();
      testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                ((EqHelper *)local_418,"0","this->GetOutput().size()",&local_41c,&local_428);
      std::__cxx11::string::~string((string *)&local_448);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
      if (!bVar1) {
        testing::Message::Message(&local_450);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_418);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                   ,0x46c,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_450)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_450);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
      proto2_nofieldpresence_unittest::TestAllTypes::set_optional_int32
                ((TestAllTypes *)&output_sink,1);
      local_469 = TestSerialize<absl::lts_20250127::Cord>((MessageLite *)&output_sink,output);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_468,&local_469,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
      if (!bVar1) {
        testing::Message::Message(&local_478);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_2.message_,(internal *)local_468,
                   (AssertionResult *)"TestSerialize(message, &output_sink)","false","true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_480,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                   ,0x46f,pcVar2);
        testing::internal::AssertHelper::operator=(&local_480,&local_478);
        testing::internal::AssertHelper::~AssertHelper(&local_480);
        std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_478);
      }
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
      if (gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        local_4b4 = 2;
        protobuf::(anonymous_namespace)::NoFieldPresenceSerializeTest<absl::lts_20250127::Cord>::
        GetOutput_abi_cxx11_(&local_4e0,this);
        local_4c0 = std::__cxx11::string::size();
        testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                  ((EqHelper *)local_4b0,"2","this->GetOutput().size()",&local_4b4,&local_4c0);
        std::__cxx11::string::~string((string *)&local_4e0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
        if (!bVar1) {
          testing::Message::Message(&local_4e8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4b0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                     ,0x470,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_3.message_,&local_4e8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
          testing::Message::~Message(&local_4e8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
        protobuf::(anonymous_namespace)::NoFieldPresenceSerializeTest<absl::lts_20250127::Cord>::
        GetOutput_abi_cxx11_(&local_520,this);
        testing::internal::EqHelper::
        Compare<char[3],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                  ((EqHelper *)local_500,"\"\\x08\\x01\"","this->GetOutput()",
                   (char (*) [3])0x1db2697,&local_520);
        std::__cxx11::string::~string((string *)&local_520);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
        if (!bVar1) {
          testing::Message::Message(&local_528);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                     ,0x471,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__3.message_,&local_528);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
          testing::Message::~Message(&local_528);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
        proto2_nofieldpresence_unittest::TestAllTypes::set_optional_int32
                  ((TestAllTypes *)&output_sink,0);
        local_541 = TestSerialize<absl::lts_20250127::Cord>((MessageLite *)&output_sink,output);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_540,&local_541,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_540);
        if (!bVar1) {
          testing::Message::Message(&local_550);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_4.message_,(internal *)local_540,
                     (AssertionResult *)"TestSerialize(message, &output_sink)","false","true",in_R9)
          ;
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_558,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                     ,0x474,pcVar2);
          testing::internal::AssertHelper::operator=(&local_558,&local_550);
          testing::internal::AssertHelper::~AssertHelper(&local_558);
          std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_550);
        }
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_540);
        if (gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          local_58c = 0;
          protobuf::(anonymous_namespace)::NoFieldPresenceSerializeTest<absl::lts_20250127::Cord>::
          GetOutput_abi_cxx11_(&local_5b8,this);
          local_598 = std::__cxx11::string::size();
          testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                    ((EqHelper *)local_588,"0","this->GetOutput().size()",&local_58c,&local_598);
          std::__cxx11::string::~string((string *)&local_5b8);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_588);
          if (!bVar1) {
            testing::Message::Message(&local_5c0);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_588);
            testing::internal::AssertHelper::AssertHelper
                      (&local_5c8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                       ,0x475,pcVar2);
            testing::internal::AssertHelper::operator=(&local_5c8,&local_5c0);
            testing::internal::AssertHelper::~AssertHelper(&local_5c8);
            testing::Message::~Message(&local_5c0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_588);
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ = 0;
        }
      }
    }
  }
  proto2_nofieldpresence_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)&output_sink);
  return;
}

Assistant:

TYPED_TEST(NoFieldPresenceSerializeTest, DontSerializeDefaultValuesTest) {
  // check that serialized data contains only non-zero numeric fields/non-empty
  // string/byte fields.
  TestAllTypes message;
  TypeParam& output_sink = this->GetOutputSinkRef();

  // All default values -> no output.
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_EQ(0, this->GetOutput().size());

  // Zero values -> still no output.
  message.set_optional_int32(0);
  message.set_optional_int64(0);
  message.set_optional_uint32(0);
  message.set_optional_uint64(0);
  message.set_optional_sint32(0);
  message.set_optional_sint64(0);
  message.set_optional_fixed32(0);
  message.set_optional_fixed64(0);
  message.set_optional_sfixed32(0);
  message.set_optional_sfixed64(0);
  message.set_optional_float(0);
  message.set_optional_double(0);
  message.set_optional_bool(false);
  message.set_optional_string("");
  message.set_optional_bytes("");
  message.set_optional_nested_enum(TestAllTypes::FOO);  // first enum entry
  message.set_optional_foreign_enum(FOREIGN_FOO);       // first enum entry
  message.set_optional_string_piece("");

  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_EQ(0, this->GetOutput().size());

  message.set_optional_int32(1);
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_EQ(2, this->GetOutput().size());
  EXPECT_EQ("\x08\x01", this->GetOutput());

  message.set_optional_int32(0);
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_EQ(0, this->GetOutput().size());
}